

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.hpp
# Opt level: O0

void __thiscall test_suite::detail::simple_runner::~simple_runner(simple_runner *this)

{
  ostream *poVar1;
  size_type sVar2;
  atomic<unsigned_long> *paVar3;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_50;
  elapsed local_48;
  simple_runner *local_40;
  simple_runner *this_local;
  memory_order local_30;
  int local_2c;
  memory_order __b_1;
  ulong local_20;
  memory_order local_18;
  int local_14;
  memory_order __b;
  
  (this->super_runner)._vptr_runner = (_func_int **)&PTR__simple_runner_0014a280;
  poVar1 = this->log_;
  local_40 = this;
  local_50.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_48.d.__r = std::chrono::operator-(&local_50,&(this->all_).start);
  poVar1 = operator<<(poVar1,&local_48);
  poVar1 = std::operator<<(poVar1,", ");
  sVar2 = std::
          vector<test_suite::detail::simple_runner::summary,_std::allocator<test_suite::detail::simple_runner::summary>_>
          ::size(&this->v_);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
  poVar1 = std::operator<<(poVar1," suites, ");
  paVar3 = &(this->all_).failed;
  local_14 = 5;
  ___b = paVar3;
  local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  if (local_14 - 1U < 2) {
    local_20 = (paVar3->super___atomic_base<unsigned_long>)._M_i;
  }
  else if (local_14 == 5) {
    local_20 = (paVar3->super___atomic_base<unsigned_long>)._M_i;
  }
  else {
    local_20 = (paVar3->super___atomic_base<unsigned_long>)._M_i;
  }
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20);
  poVar1 = std::operator<<(poVar1," failures, ");
  paVar3 = &(this->all_).total;
  local_2c = 5;
  ___b_1 = paVar3;
  local_30 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  if (local_2c - 1U < 2) {
    this_local = (simple_runner *)(paVar3->super___atomic_base<unsigned_long>)._M_i;
  }
  else if (local_2c == 5) {
    this_local = (simple_runner *)(paVar3->super___atomic_base<unsigned_long>)._M_i;
  }
  else {
    this_local = (simple_runner *)(paVar3->super___atomic_base<unsigned_long>)._M_i;
  }
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ulong)this_local);
  poVar1 = std::operator<<(poVar1," total.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::
  vector<test_suite::detail::simple_runner::summary,_std::allocator<test_suite::detail::simple_runner::summary>_>
  ::~vector(&this->v_);
  runner::~runner(&this->super_runner);
  return;
}

Assistant:

~simple_runner()
  {
    log_ <<
         elapsed{clock_type::now() -
                 all_.start } << ", " <<
         v_.size() << " suites, " <<
         all_.failed.load() << " failures, " <<
         all_.total.load() << " total." <<
         std::endl;
  }